

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O1

FADFADSTATE * FADsinh(FADFADSTATE *__return_storage_ptr__,FADFADSTATE *x)

{
  double dVar1;
  uint sz;
  double *pdVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  FADFADSTATE *resa;
  Fad<double> sinhval;
  Fad<double> coshval;
  Fad<double> local_b8;
  Fad<double> local_98;
  FadExpr<FadFuncCosh<Fad<double>_>_> local_78;
  undefined1 local_50 [32];
  
  FadFuncCosh<Fad<double>_>::FadFuncCosh((FadFuncCosh<Fad<double>_> *)local_50,&x->val_);
  FadExpr<FadFuncCosh<Fad<double>_>_>::FadExpr(&local_78,(FadFuncCosh<Fad<double>_> *)local_50);
  Fad<double>::~Fad((Fad<double> *)local_50);
  local_98.val_ = cosh(local_78.fadexpr_.expr_.val_);
  iVar4 = local_78.fadexpr_.expr_.dx_.num_elts;
  local_98.dx_.num_elts = 0;
  local_98.dx_.ptr_to_data = (double *)0x0;
  if ((long)local_78.fadexpr_.expr_.dx_.num_elts < 1) {
    local_98.defaultVal = 0.0;
  }
  else {
    local_98.dx_.num_elts = local_78.fadexpr_.expr_.dx_.num_elts;
    uVar5 = (long)local_78.fadexpr_.expr_.dx_.num_elts << 3;
    local_98.dx_.ptr_to_data = (double *)operator_new__(uVar5);
    local_98.defaultVal = 0.0;
    if (0 < iVar4) {
      uVar6 = 0;
      do {
        pdVar2 = (double *)((long)local_78.fadexpr_.expr_.dx_.ptr_to_data + uVar6);
        if (local_78.fadexpr_.expr_.dx_.num_elts == 0) {
          pdVar2 = &local_78.fadexpr_.expr_.defaultVal;
        }
        dVar1 = *pdVar2;
        dVar7 = sinh(local_78.fadexpr_.expr_.val_);
        *(double *)((long)local_98.dx_.ptr_to_data + uVar6) = dVar7 * dVar1;
        uVar6 = uVar6 + 8;
      } while (uVar5 != uVar6);
    }
  }
  Fad<double>::~Fad(&local_78.fadexpr_.expr_);
  FadFuncSinh<Fad<double>_>::FadFuncSinh((FadFuncSinh<Fad<double>_> *)local_50,&x->val_);
  FadExpr<FadFuncSinh<Fad<double>_>_>::FadExpr
            ((FadExpr<FadFuncSinh<Fad<double>_>_> *)&local_78,(FadFuncSinh<Fad<double>_> *)local_50)
  ;
  Fad<double>::~Fad((Fad<double> *)local_50);
  local_b8.val_ = sinh(local_78.fadexpr_.expr_.val_);
  iVar4 = local_78.fadexpr_.expr_.dx_.num_elts;
  local_b8.dx_.num_elts = 0;
  local_b8.dx_.ptr_to_data = (double *)0x0;
  if ((long)local_78.fadexpr_.expr_.dx_.num_elts < 1) {
    local_b8.defaultVal = 0.0;
  }
  else {
    local_b8.dx_.num_elts = local_78.fadexpr_.expr_.dx_.num_elts;
    uVar5 = (long)local_78.fadexpr_.expr_.dx_.num_elts << 3;
    local_b8.dx_.ptr_to_data = (double *)operator_new__(uVar5);
    local_b8.defaultVal = 0.0;
    if (0 < iVar4) {
      uVar6 = 0;
      do {
        pdVar2 = (double *)((long)local_78.fadexpr_.expr_.dx_.ptr_to_data + uVar6);
        if (local_78.fadexpr_.expr_.dx_.num_elts == 0) {
          pdVar2 = &local_78.fadexpr_.expr_.defaultVal;
        }
        dVar1 = *pdVar2;
        dVar7 = cosh(local_78.fadexpr_.expr_.val_);
        *(double *)((long)local_b8.dx_.ptr_to_data + uVar6) = dVar7 * dVar1;
        uVar6 = uVar6 + 8;
      } while (uVar5 != uVar6);
    }
  }
  Fad<double>::~Fad(&local_78.fadexpr_.expr_);
  sz = (x->dx_).num_elts;
  Fad<Fad<double>_>::Fad(__return_storage_ptr__,sz,&local_b8);
  if (0 < (int)sz) {
    lVar3 = 0;
    iVar4 = 0;
    do {
      Fad<Fad<double>_>::dx((Fad<double> *)&local_78,x,iVar4);
      local_50._0_8_ = &local_98;
      local_50._8_8_ = (Fad<double> *)&local_78;
      Fad<double>::operator=
                ((Fad<double> *)((long)&((__return_storage_ptr__->dx_).ptr_to_data)->val_ + lVar3),
                 (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_50);
      Fad<double>::~Fad((Fad<double> *)&local_78);
      iVar4 = iVar4 + 1;
      lVar3 = lVar3 + 0x20;
    } while ((ulong)sz << 5 != lVar3);
  }
  Fad<double>::~Fad(&local_b8);
  Fad<double>::~Fad(&local_98);
  return __return_storage_ptr__;
}

Assistant:

static FADFADSTATE FADsinh(FADFADSTATE x)
{
    Fad<STATE> coshval = cosh(x.val());
    Fad<STATE> sinhval = sinh(x.val());
    int sz = x.size();
    FADFADSTATE resa(sz,sinhval);
    for (int i=0; i<sz; i++) {
        resa.fastAccessDx(i) = coshval*x.dx(i);
    }
    return resa;
}